

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ProceduralBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralBlockSymbol,slang::SourceLocation&,slang::ast::ProceduralBlockKind&,bool&>
          (BumpAllocator *this,SourceLocation *args,ProceduralBlockKind *args_1,bool *args_2)

{
  bool bVar1;
  ProceduralBlockKind PVar2;
  SourceLocation SVar3;
  ProceduralBlockSymbol *pPVar4;
  
  pPVar4 = (ProceduralBlockSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProceduralBlockSymbol *)this->endPtr < pPVar4 + 1) {
    pPVar4 = (ProceduralBlockSymbol *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pPVar4 + 1);
  }
  SVar3 = *args;
  PVar2 = *args_1;
  bVar1 = *args_2;
  (pPVar4->super_Symbol).kind = ProceduralBlock;
  (pPVar4->super_Symbol).name._M_len = 0;
  (pPVar4->super_Symbol).name._M_str = "";
  (pPVar4->super_Symbol).location = SVar3;
  (pPVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pPVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pPVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pPVar4->super_Symbol).indexInScope = 0;
  pPVar4->procedureKind = PVar2;
  pPVar4->isFromAssertion = bVar1;
  (pPVar4->blocks)._M_ptr = (pointer)0x0;
  (pPVar4->blocks)._M_extent._M_extent_value = 0;
  pPVar4->stmtSyntax = (StatementSyntax *)0x0;
  pPVar4->stmt = (Statement *)0x0;
  pPVar4->isConstructing = false;
  return pPVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }